

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O0

int acutest_cmdline_read_
              (ACUTEST_CMDLINE_OPTION_ *options,int argc,char **argv,
              _func_int_int_char_ptr *callback)

{
  int iVar1;
  char *pcVar2;
  code *in_RCX;
  long in_RDX;
  int in_ESI;
  char *in_RDI;
  size_t len_1;
  char *assignment;
  char *badoptname;
  size_t len;
  int ret;
  int i;
  int after_doubledash;
  char auxbuf [33];
  ACUTEST_CMDLINE_OPTION_ *opt;
  size_t local_88;
  char *local_78;
  _func_int_int_char_ptr *in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff98;
  int iVar3;
  int iVar4;
  int iVar5;
  char local_58 [32];
  undefined1 local_38;
  char *local_30;
  code *local_28;
  long local_20;
  int local_14;
  char *local_10;
  
  iVar5 = 0;
  iVar4 = 1;
  iVar3 = 0;
  local_38 = 0;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  do {
    if (local_14 <= iVar4) {
      return iVar3;
    }
    if ((iVar5 == 0) && (iVar1 = strcmp(*(char **)(local_20 + (long)iVar4 * 8),"-"), iVar1 != 0)) {
      iVar1 = strcmp(*(char **)(local_20 + (long)iVar4 * 8),"--");
      if (iVar1 == 0) {
        iVar5 = 1;
      }
      else if (**(char **)(local_20 + (long)iVar4 * 8) == '-') {
        for (local_30 = local_10; *(int *)(local_30 + 0x10) != 0; local_30 = local_30 + 0x18) {
          if ((*(long *)(local_30 + 8) == 0) ||
             (iVar1 = strncmp(*(char **)(local_20 + (long)iVar4 * 8),"--",2), iVar1 != 0)) {
            if ((*local_30 != '\0') &&
               ((**(char **)(local_20 + (long)iVar4 * 8) == '-' &&
                (*(char *)(*(long *)(local_20 + (long)iVar4 * 8) + 1) == *local_30)))) {
              if ((*(uint *)(local_30 + 0x14) & 2) == 0) {
                iVar3 = (*local_28)(*(undefined4 *)(local_30 + 0x10),0);
                if ((iVar3 == 0) && (*(char *)(*(long *)(local_20 + (long)iVar4 * 8) + 2) != '\0'))
                {
                  iVar3 = acutest_cmdline_handle_short_opt_group_
                                    ((ACUTEST_CMDLINE_OPTION_ *)CONCAT44(iVar5,iVar4),
                                     (char *)(ulong)in_stack_ffffffffffffff98,
                                     in_stack_ffffffffffffff90);
                }
              }
              else if (*(char *)(*(long *)(local_20 + (long)iVar4 * 8) + 2) == '\0') {
                if (iVar4 + 1 < local_14) {
                  iVar4 = iVar4 + 1;
                  iVar3 = (*local_28)(*(undefined4 *)(local_30 + 0x10),
                                      *(undefined8 *)(local_20 + (long)iVar4 * 8));
                }
                else {
                  iVar3 = (*local_28)(0x80000002,*(undefined8 *)(local_20 + (long)iVar4 * 8));
                }
              }
              else {
                iVar3 = (*local_28)(*(undefined4 *)(local_30 + 0x10),
                                    *(long *)(local_20 + (long)iVar4 * 8) + 2);
              }
              break;
            }
          }
          else {
            in_stack_ffffffffffffff90 = (_func_int_int_char_ptr *)strlen(*(char **)(local_30 + 8));
            iVar1 = strncmp((char *)(*(long *)(local_20 + (long)iVar4 * 8) + 2),
                            *(char **)(local_30 + 8),(size_t)in_stack_ffffffffffffff90);
            if (iVar1 == 0) {
              if (in_stack_ffffffffffffff90[*(long *)(local_20 + (long)iVar4 * 8) + 2] ==
                  (_func_int_int_char_ptr)0x0) {
                if ((*(uint *)(local_30 + 0x14) & 2) == 0) {
                  iVar3 = (*local_28)(*(undefined4 *)(local_30 + 0x10),0);
                }
                else {
                  iVar3 = (*local_28)(0x80000002,*(undefined8 *)(local_20 + (long)iVar4 * 8));
                }
                break;
              }
              if (in_stack_ffffffffffffff90[*(long *)(local_20 + (long)iVar4 * 8) + 2] ==
                  (_func_int_int_char_ptr)0x3d) {
                if ((*(uint *)(local_30 + 0x14) & 3) == 0) {
                  snprintf(local_58,0x21,"--%s",*(undefined8 *)(local_30 + 8));
                  iVar3 = (*local_28)(0x80000003,local_58);
                }
                else {
                  iVar3 = (*local_28)(*(undefined4 *)(local_30 + 0x10),
                                      in_stack_ffffffffffffff90 +
                                      *(long *)(local_20 + (long)iVar4 * 8) + 3);
                }
                break;
              }
            }
          }
        }
        if (*(int *)(local_30 + 0x10) == 0) {
          if (**(char **)(local_20 + (long)iVar4 * 8) == '-') {
            local_78 = *(char **)(local_20 + (long)iVar4 * 8);
            iVar3 = strncmp(local_78,"--",2);
            if ((iVar3 == 0) && (pcVar2 = strchr(local_78,0x3d), pcVar2 != (char *)0x0)) {
              local_88 = (long)pcVar2 - (long)local_78;
              if (0x20 < local_88) {
                local_88 = 0x20;
              }
              strncpy(local_58,local_78,local_88);
              local_58[local_88] = '\0';
              local_78 = local_58;
            }
            iVar3 = (*local_28)(0x80000001,local_78);
          }
          else {
            iVar3 = (*local_28)(0,*(undefined8 *)(local_20 + (long)iVar4 * 8));
          }
        }
      }
      else {
        iVar3 = (*local_28)(0,*(undefined8 *)(local_20 + (long)iVar4 * 8));
      }
    }
    else {
      iVar3 = (*local_28)(0,*(undefined8 *)(local_20 + (long)iVar4 * 8));
    }
    if (iVar3 != 0) {
      return iVar3;
    }
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

static int
acutest_cmdline_read_(const ACUTEST_CMDLINE_OPTION_* options, int argc, char** argv,
                      int (*callback)(int /*optval*/, const char* /*arg*/))
{

    const ACUTEST_CMDLINE_OPTION_* opt;
    char auxbuf[ACUTEST_CMDLINE_AUXBUF_SIZE_+1];
    int after_doubledash = 0;
    int i = 1;
    int ret = 0;

    auxbuf[ACUTEST_CMDLINE_AUXBUF_SIZE_] = '\0';

    while(i < argc) {
        if(after_doubledash  ||  strcmp(argv[i], "-") == 0) {
            /* Non-option argument. */
            ret = callback(ACUTEST_CMDLINE_OPTID_NONE_, argv[i]);
        } else if(strcmp(argv[i], "--") == 0) {
            /* End of options. All the remaining members are non-option arguments. */
            after_doubledash = 1;
        } else if(argv[i][0] != '-') {
            /* Non-option argument. */
            ret = callback(ACUTEST_CMDLINE_OPTID_NONE_, argv[i]);
        } else {
            for(opt = options; opt->id != 0; opt++) {
                if(opt->longname != NULL  &&  strncmp(argv[i], "--", 2) == 0) {
                    size_t len = strlen(opt->longname);
                    if(strncmp(argv[i]+2, opt->longname, len) == 0) {
                        /* Regular long option. */
                        if(argv[i][2+len] == '\0') {
                            /* with no argument provided. */
                            if(!(opt->flags & ACUTEST_CMDLINE_OPTFLAG_REQUIREDARG_))
                                ret = callback(opt->id, NULL);
                            else
                                ret = callback(ACUTEST_CMDLINE_OPTID_MISSINGARG_, argv[i]);
                            break;
                        } else if(argv[i][2+len] == '=') {
                            /* with an argument provided. */
                            if(opt->flags & (ACUTEST_CMDLINE_OPTFLAG_OPTIONALARG_ | ACUTEST_CMDLINE_OPTFLAG_REQUIREDARG_)) {
                                ret = callback(opt->id, argv[i]+2+len+1);
                            } else {
                                snprintf(auxbuf, sizeof(auxbuf), "--%s", opt->longname);
                                ret = callback(ACUTEST_CMDLINE_OPTID_BOGUSARG_, auxbuf);
                            }
                            break;
                        } else {
                            continue;
                        }
                    }
                } else if(opt->shortname != '\0'  &&  argv[i][0] == '-') {
                    if(argv[i][1] == opt->shortname) {
                        /* Regular short option. */
                        if(opt->flags & ACUTEST_CMDLINE_OPTFLAG_REQUIREDARG_) {
                            if(argv[i][2] != '\0')
                                ret = callback(opt->id, argv[i]+2);
                            else if(i+1 < argc)
                                ret = callback(opt->id, argv[++i]);
                            else
                                ret = callback(ACUTEST_CMDLINE_OPTID_MISSINGARG_, argv[i]);
                            break;
                        } else {
                            ret = callback(opt->id, NULL);

                            /* There might be more (argument-less) short options
                             * grouped together. */
                            if(ret == 0  &&  argv[i][2] != '\0')
                                ret = acutest_cmdline_handle_short_opt_group_(options, argv[i]+2, callback);
                            break;
                        }
                    }
                }
            }

            if(opt->id == 0) {  /* still not handled? */
                if(argv[i][0] != '-') {
                    /* Non-option argument. */
                    ret = callback(ACUTEST_CMDLINE_OPTID_NONE_, argv[i]);
                } else {
                    /* Unknown option. */
                    char* badoptname = argv[i];

                    if(strncmp(badoptname, "--", 2) == 0) {
                        /* Strip any argument from the long option. */
                        char* assignment = strchr(badoptname, '=');
                        if(assignment != NULL) {
                            size_t len = (size_t)(assignment - badoptname);
                            if(len > ACUTEST_CMDLINE_AUXBUF_SIZE_)
                                len = ACUTEST_CMDLINE_AUXBUF_SIZE_;
                            strncpy(auxbuf, badoptname, len);
                            auxbuf[len] = '\0';
                            badoptname = auxbuf;
                        }
                    }

                    ret = callback(ACUTEST_CMDLINE_OPTID_UNKNOWN_, badoptname);
                }
            }
        }

        if(ret != 0)
            return ret;
        i++;
    }

    return ret;
}